

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O1

string * cmRemoveQuotes_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  char *pcVar1;
  ulong uVar2;
  
  pcVar1 = str._M_str;
  uVar2 = str._M_len;
  if (((1 < uVar2) && (*pcVar1 == '\"')) && (pcVar1[uVar2 - 1] == '\"')) {
    pcVar1 = pcVar1 + 1;
    uVar2 = uVar2 - 2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRemoveQuotes(cm::string_view str)
{
  // We process only strings that have two quotes at least.
  // Also front() and back() are only defined behavior on non empty strings.
  if (str.size() >= 2 &&    //
      str.front() == '"' && //
      str.back() == '"') {
    // Remove a quote from the front and back
    str.remove_prefix(1);
    str.remove_suffix(1);
  }
  return std::string(str);
}